

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

void expand_cache_path(char *path,char *dir,char *fn)

{
  char *in_RAX;
  char *pcVar1;
  ulong uVar2;
  size_t sVar3;
  char *__dest;
  char *endp;
  
  endp = in_RAX;
  do {
    while( true ) {
      while( true ) {
        pcVar1 = strchr(dir,0x25);
        if (pcVar1 == (char *)0x0) {
          strcpy(path,dir);
          sVar3 = strlen(dir);
          pcVar1 = path + sVar3;
          if ((*fn != '\0') && (pcVar1[-1] != '/')) {
            *pcVar1 = '/';
            pcVar1 = pcVar1 + 1;
          }
          strcpy(pcVar1,fn);
          return;
        }
        strncpy(path,dir,(long)pcVar1 - (long)dir);
        __dest = path + ((long)pcVar1 - (long)dir);
        if (pcVar1[1] != 's') break;
        strcpy(__dest,fn);
        sVar3 = strlen(fn);
        path = __dest + sVar3;
        fn = fn + sVar3;
        dir = pcVar1 + 2;
      }
      if ((byte)(pcVar1[1] - 0x30U) < 10) break;
LAB_00125ecf:
      *__dest = '%';
      dir = pcVar1 + 2;
      __dest[1] = pcVar1[1];
      path = __dest + 2;
    }
    uVar2 = strtol(pcVar1 + 1,&endp,10);
    if (*endp != 's') goto LAB_00125ecf;
    sVar3 = strlen(fn);
    if (uVar2 < sVar3) {
      sVar3 = uVar2;
    }
    strncpy(__dest,fn,sVar3);
    path = __dest + sVar3;
    fn = fn + sVar3;
    __dest[sVar3] = '\0';
    dir = endp + 1;
  } while( true );
}

Assistant:

void expand_cache_path(char *path, char *dir, char *fn) {
    char *cp;

    while ((cp = strchr(dir, '%'))) {
	strncpy(path, dir, cp-dir);
	path += cp-dir;

	if (*++cp == 's') {
	    strcpy(path, fn);
	    path += strlen(fn);
	    fn += strlen(fn);
	    cp++;
	} else if (*cp >= '0' && *cp <= '9') {
	    char *endp;
	    long l;

	    l = strtol(cp, &endp, 10);
	    l = MIN(l, strlen(fn));
	    if (*endp == 's') {
		strncpy(path, fn, l);
		path += l;
		fn += l;
		*path = 0;
		cp = endp+1;
	    } else {
		*path++ = '%';
		*path++ = *cp++;
	    }
	} else {
	    *path++ = '%';
	    *path++ = *cp++;
	}
	dir = cp;
    }
    strcpy(path, dir);
    path += strlen(dir);
    if (*fn && path[-1] != '/')
	*path++ = '/';
    strcpy(path, fn);
}